

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O0

void cft_fasttext_quantize(fasttext_t *handle,fasttext_args_t *args,char **errptr)

{
  function<void_(float,_float,_double,_double,_long)> *in_RDI;
  invalid_argument *e;
  Args *a;
  TrainCallback *in_stack_000000e0;
  Args *in_stack_000000e8;
  FastText *in_stack_000000f0;
  
  std::function<void_(float,_float,_double,_double,_long)>::function(in_RDI);
  fasttext::FastText::quantize(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
  std::function<void_(float,_float,_double,_double,_long)>::~function
            ((function<void_(float,_float,_double,_double,_long)> *)0x18fb30);
  return;
}

Assistant:

void cft_fasttext_quantize(fasttext_t* handle, fasttext_args_t* args, char** errptr) {
    Args* a = (Args*)args;
    try {
        ((FastText*)handle)->quantize(*a);
    } catch (const std::invalid_argument& e) {
        save_error(errptr, e);
    }
}